

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O0

void duckdb::DuckDBFunctionsFun::RegisterFunction(BuiltinFunctions *set)

{
  TableFunction *in_stack_000001b8;
  BuiltinFunctions *in_stack_000001c0;
  TableFunction *this;
  _func_int **local_218;
  string sStack_210;
  allocator local_1e1;
  string local_1e0 [40];
  pointer in_stack_fffffffffffffe48;
  pointer in_stack_fffffffffffffe50;
  pointer in_stack_fffffffffffffe58;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe60;
  element_type *in_stack_fffffffffffffe68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe70;
  table_function_init_local_t in_stack_fffffffffffffe80;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1e0,"duckdb_functions",&local_1e1);
  local_218 = (_func_int **)0x0;
  sStack_210._M_dataplus = (_Alloc_hider)0x0;
  sStack_210._1_7_ = 0;
  sStack_210._M_string_length = 0;
  this = (TableFunction *)&local_218;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x140af33);
  TableFunction::TableFunction
            ((TableFunction *)in_stack_fffffffffffffe70._M_pi,(string *)in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60,(table_function_t)in_stack_fffffffffffffe58,
             (table_function_bind_t)in_stack_fffffffffffffe50,
             (table_function_init_global_t)in_stack_fffffffffffffe48,in_stack_fffffffffffffe80);
  BuiltinFunctions::AddFunction(in_stack_000001c0,in_stack_000001b8);
  TableFunction::~TableFunction(this);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x140af8d);
  ::std::__cxx11::string::~string(local_1e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  return;
}

Assistant:

void DuckDBFunctionsFun::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(
	    TableFunction("duckdb_functions", {}, DuckDBFunctionsFunction, DuckDBFunctionsBind, DuckDBFunctionsInit));
}